

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O0

void __thiscall
de::Random::
choose<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>,void**>
          (Random *this,
          __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> first,
          __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> last,
          void **result,int numItems)

{
  bool bVar1;
  int iVar2;
  reference ppvVar3;
  int local_30;
  int r;
  int ndx;
  int numItems_local;
  void **result_local;
  Random *this_local;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> last_local;
  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_> first_local;
  
  local_30 = 0;
  this_local = (Random *)last._M_current;
  last_local._M_current = first._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&last_local,
                            (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                             *)&this_local), bVar1) {
    if (local_30 < numItems) {
      ppvVar3 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                ::operator*(&last_local);
      result[local_30] = *ppvVar3;
    }
    else {
      iVar2 = getInt(this,0,local_30);
      if (iVar2 < numItems) {
        ppvVar3 = __gnu_cxx::
                  __normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
                  operator*(&last_local);
        result[iVar2] = *ppvVar3;
      }
    }
    __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::operator++
              (&last_local);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}